

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGCompile(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict def)

{
  int iVar1;
  xmlAutomataPtr pxVar2;
  xmlAutomataStatePtr pxVar3;
  _xmlRegexp *p_Var4;
  xmlAutomataStatePtr pxVar5;
  xmlAutomataPtr pxVar6;
  xmlRelaxNGDefinePtr_conflict pxVar7;
  xmlAutomataPtr oldam;
  xmlRelaxNGDefinePtr pxVar8;
  
  if (def == (xmlRelaxNGDefinePtr_conflict)0x0) {
    return -1;
  }
  while (def->type == XML_RELAXNG_NOOP) {
    def = def->content;
    if (def == (xmlRelaxNGDefinePtr)0x0) {
      return -1;
    }
  }
  switch(def->type) {
  case XML_RELAXNG_EMPTY:
    pxVar6 = ctxt->am;
    pxVar5 = ctxt->state;
    goto LAB_00176f9e;
  case XML_RELAXNG_NOT_ALLOWED:
  case XML_RELAXNG_EXCEPT:
  case XML_RELAXNG_DATATYPE:
  case XML_RELAXNG_PARAM:
  case XML_RELAXNG_VALUE:
  case XML_RELAXNG_LIST:
  case XML_RELAXNG_ATTRIBUTE:
  case XML_RELAXNG_INTERLEAVE:
    xmlRelaxNGCompile_cold_1();
    break;
  case XML_RELAXNG_TEXT:
    pxVar5 = xmlAutomataNewEpsilon(ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0);
    ctxt->state = pxVar5;
    xmlRelaxNGCompile(ctxt,def->content);
    xmlAutomataNewTransition(ctxt->am,ctxt->state,ctxt->state,(xmlChar *)"#text",(void *)0x0);
    goto LAB_00176ed1;
  case XML_RELAXNG_ELEMENT:
    if ((ctxt->am != (xmlAutomataPtr)0x0) && (def->name != (xmlChar *)0x0)) {
      pxVar5 = xmlAutomataNewTransition2
                         (ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0,def->name,def->ns,def);
      ctxt->state = pxVar5;
    }
    if ((def->dflags & 0x40) == 0) {
      pxVar6 = ctxt->am;
    }
    else {
      pxVar6 = ctxt->am;
      if (def->depth != -0x19) {
        pxVar5 = ctxt->state;
        def->depth = -0x19;
        pxVar7 = def->content;
        pxVar2 = xmlNewAutomata();
        ctxt->am = pxVar2;
        if (pxVar2 != (xmlAutomataPtr)0x0) {
          xmlAutomataSetFlags(pxVar2,1);
          pxVar3 = xmlAutomataGetInitState(ctxt->am);
          ctxt->state = pxVar3;
          if (pxVar7 != (xmlRelaxNGDefinePtr_conflict)0x0) {
            do {
              xmlRelaxNGCompile(ctxt,pxVar7);
              pxVar7 = pxVar7->next;
            } while (pxVar7 != (xmlRelaxNGDefinePtr)0x0);
            pxVar3 = ctxt->state;
          }
          xmlAutomataSetFinalState(ctxt->am,pxVar3);
          p_Var4 = xmlAutomataCompile(ctxt->am);
          def->contModel = p_Var4;
          iVar1 = xmlRegexpIsDeterminist(p_Var4);
          if (iVar1 == 0) {
            xmlRegFreeRegexp(def->contModel);
            def->contModel = (xmlRegexpPtr)0x0;
          }
          xmlFreeAutomata(ctxt->am);
          ctxt->state = pxVar5;
          ctxt->am = pxVar6;
          return 0;
        }
        return -1;
      }
    }
    iVar1 = xmlRelaxNGTryCompile(ctxt,def);
    ctxt->am = pxVar6;
    return iVar1;
  case XML_RELAXNG_DEF:
  case XML_RELAXNG_REF:
  case XML_RELAXNG_EXTERNALREF:
  case XML_RELAXNG_PARENTREF:
  case XML_RELAXNG_GROUP:
    for (pxVar8 = def->content; pxVar8 != (xmlRelaxNGDefinePtr_conflict)0x0; pxVar8 = pxVar8->next)
    {
      iVar1 = xmlRelaxNGCompile(ctxt,pxVar8);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    break;
  case XML_RELAXNG_OPTIONAL:
    pxVar5 = ctxt->state;
    pxVar8 = def->content;
    pxVar3 = pxVar5;
    if (pxVar8 != (xmlRelaxNGDefinePtr)0x0) {
      do {
        xmlRelaxNGCompile(ctxt,pxVar8);
        pxVar8 = pxVar8->next;
      } while (pxVar8 != (xmlRelaxNGDefinePtr)0x0);
      pxVar3 = ctxt->state;
    }
    xmlAutomataNewEpsilon(ctxt->am,pxVar5,pxVar3);
    break;
  case XML_RELAXNG_ZEROORMORE:
    pxVar5 = xmlAutomataNewEpsilon(ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0);
    ctxt->state = pxVar5;
    pxVar8 = def->content;
    pxVar3 = pxVar5;
    if (pxVar8 != (xmlRelaxNGDefinePtr)0x0) {
      do {
        xmlRelaxNGCompile(ctxt,pxVar8);
        pxVar8 = pxVar8->next;
      } while (pxVar8 != (xmlRelaxNGDefinePtr)0x0);
      pxVar3 = ctxt->state;
    }
    xmlAutomataNewEpsilon(ctxt->am,pxVar3,pxVar5);
LAB_00176ed1:
    pxVar6 = ctxt->am;
LAB_00176f9e:
    pxVar5 = xmlAutomataNewEpsilon(pxVar6,pxVar5,(xmlAutomataStatePtr)0x0);
    ctxt->state = pxVar5;
    return 0;
  case XML_RELAXNG_ONEORMORE:
    pxVar8 = def->content;
    if (pxVar8 == (xmlRelaxNGDefinePtr)0x0) {
      pxVar3 = ctxt->state;
      pxVar5 = pxVar3;
    }
    else {
      do {
        xmlRelaxNGCompile(ctxt,pxVar8);
        pxVar8 = pxVar8->next;
      } while (pxVar8 != (xmlRelaxNGDefinePtr)0x0);
      pxVar8 = def->content;
      pxVar5 = ctxt->state;
      pxVar3 = pxVar5;
      if (pxVar8 != (xmlRelaxNGDefinePtr)0x0) {
        do {
          xmlRelaxNGCompile(ctxt,pxVar8);
          pxVar8 = pxVar8->next;
        } while (pxVar8 != (xmlRelaxNGDefinePtr)0x0);
        pxVar3 = ctxt->state;
      }
    }
    xmlAutomataNewEpsilon(ctxt->am,pxVar3,pxVar5);
    pxVar6 = ctxt->am;
    goto LAB_00176f9e;
  case XML_RELAXNG_CHOICE:
    pxVar7 = def->content;
    if (pxVar7 == (xmlRelaxNGDefinePtr_conflict)0x0) {
      pxVar5 = (xmlAutomataStatePtr)0x0;
    }
    else {
      pxVar3 = ctxt->state;
      pxVar5 = (xmlAutomataStatePtr)0x0;
      do {
        ctxt->state = pxVar3;
        iVar1 = xmlRelaxNGCompile(ctxt,pxVar7);
        if (iVar1 != 0) goto LAB_00176fb4;
        if (pxVar5 == (xmlAutomataStatePtr)0x0) {
          pxVar5 = ctxt->state;
        }
        else {
          xmlAutomataNewEpsilon(ctxt->am,ctxt->state,pxVar5);
        }
        pxVar7 = pxVar7->next;
      } while (pxVar7 != (xmlRelaxNGDefinePtr)0x0);
    }
    iVar1 = 0;
LAB_00176fb4:
    ctxt->state = pxVar5;
    return iVar1;
  case XML_RELAXNG_START:
    iVar1 = xmlRelaxNGIsCompilable(def);
    if ((iVar1 == 1) && (def->depth != -0x19)) {
      pxVar6 = ctxt->am;
      pxVar5 = ctxt->state;
      def->depth = -0x19;
      pxVar7 = def->content;
      pxVar2 = xmlNewAutomata();
      ctxt->am = pxVar2;
      if (pxVar2 == (xmlAutomataPtr)0x0) {
        return -1;
      }
      xmlAutomataSetFlags(pxVar2,1);
      pxVar3 = xmlAutomataGetInitState(ctxt->am);
      ctxt->state = pxVar3;
      if (pxVar7 != (xmlRelaxNGDefinePtr_conflict)0x0) {
        do {
          xmlRelaxNGCompile(ctxt,pxVar7);
          pxVar7 = pxVar7->next;
        } while (pxVar7 != (xmlRelaxNGDefinePtr)0x0);
        pxVar3 = ctxt->state;
      }
      xmlAutomataSetFinalState(ctxt->am,pxVar3);
      iVar1 = xmlAutomataIsDeterminist(ctxt->am);
      if (iVar1 != 0) {
        p_Var4 = xmlAutomataCompile(ctxt->am);
        def->contModel = p_Var4;
      }
      xmlFreeAutomata(ctxt->am);
      ctxt->am = pxVar6;
      ctxt->state = pxVar5;
    }
  }
  return 0;
}

Assistant:

static int
xmlRelaxNGCompile(xmlRelaxNGParserCtxtPtr ctxt, xmlRelaxNGDefinePtr def)
{
    int ret = 0;
    xmlRelaxNGDefinePtr list;

    if ((ctxt == NULL) || (def == NULL))
        return (-1);

    switch (def->type) {
        case XML_RELAXNG_START:
            if ((xmlRelaxNGIsCompilable(def) == 1) && (def->depth != -25)) {
                xmlAutomataPtr oldam = ctxt->am;
                xmlAutomataStatePtr oldstate = ctxt->state;

                def->depth = -25;

                list = def->content;
                ctxt->am = xmlNewAutomata();
                if (ctxt->am == NULL)
                    return (-1);

                /*
                 * assume identical strings but not same pointer are different
                 * atoms, needed for non-determinism detection
                 * That way if 2 elements with the same name are in a choice
                 * branch the automata is found non-deterministic and
                 * we fallback to the normal validation which does the right
                 * thing of exploring both choices.
                 */
                xmlAutomataSetFlags(ctxt->am, 1);

                ctxt->state = xmlAutomataGetInitState(ctxt->am);
                while (list != NULL) {
                    xmlRelaxNGCompile(ctxt, list);
                    list = list->next;
                }
                xmlAutomataSetFinalState(ctxt->am, ctxt->state);
                if (xmlAutomataIsDeterminist(ctxt->am))
                    def->contModel = xmlAutomataCompile(ctxt->am);

                xmlFreeAutomata(ctxt->am);
                ctxt->state = oldstate;
                ctxt->am = oldam;
            }
            break;
        case XML_RELAXNG_ELEMENT:
            if ((ctxt->am != NULL) && (def->name != NULL)) {
                ctxt->state = xmlAutomataNewTransition2(ctxt->am,
                                                        ctxt->state, NULL,
                                                        def->name, def->ns,
                                                        def);
            }
            if ((def->dflags & IS_COMPILABLE) && (def->depth != -25)) {
                xmlAutomataPtr oldam = ctxt->am;
                xmlAutomataStatePtr oldstate = ctxt->state;

                def->depth = -25;

                list = def->content;
                ctxt->am = xmlNewAutomata();
                if (ctxt->am == NULL)
                    return (-1);
                xmlAutomataSetFlags(ctxt->am, 1);
                ctxt->state = xmlAutomataGetInitState(ctxt->am);
                while (list != NULL) {
                    xmlRelaxNGCompile(ctxt, list);
                    list = list->next;
                }
                xmlAutomataSetFinalState(ctxt->am, ctxt->state);
                def->contModel = xmlAutomataCompile(ctxt->am);
                if (!xmlRegexpIsDeterminist(def->contModel)) {
#ifdef DEBUG_COMPILE
                    xmlGenericError(xmlGenericErrorContext,
                        "Content model not determinist %s\n",
                                    def->name);
#endif
                    /*
                     * we can only use the automata if it is determinist
                     */
                    xmlRegFreeRegexp(def->contModel);
                    def->contModel = NULL;
                }
                xmlFreeAutomata(ctxt->am);
                ctxt->state = oldstate;
                ctxt->am = oldam;
            } else {
                xmlAutomataPtr oldam = ctxt->am;

                /*
                 * we can't build the content model for this element content
                 * but it still might be possible to build it for some of its
                 * children, recurse.
                 */
                ret = xmlRelaxNGTryCompile(ctxt, def);
                ctxt->am = oldam;
            }
            break;
        case XML_RELAXNG_NOOP:
            ret = xmlRelaxNGCompile(ctxt, def->content);
            break;
        case XML_RELAXNG_OPTIONAL:{
                xmlAutomataStatePtr oldstate = ctxt->state;

                list = def->content;
                while (list != NULL) {
                    xmlRelaxNGCompile(ctxt, list);
                    list = list->next;
                }
                xmlAutomataNewEpsilon(ctxt->am, oldstate, ctxt->state);
                break;
            }
        case XML_RELAXNG_ZEROORMORE:{
                xmlAutomataStatePtr oldstate;

                ctxt->state =
                    xmlAutomataNewEpsilon(ctxt->am, ctxt->state, NULL);
                oldstate = ctxt->state;
                list = def->content;
                while (list != NULL) {
                    xmlRelaxNGCompile(ctxt, list);
                    list = list->next;
                }
                xmlAutomataNewEpsilon(ctxt->am, ctxt->state, oldstate);
                ctxt->state =
                    xmlAutomataNewEpsilon(ctxt->am, oldstate, NULL);
                break;
            }
        case XML_RELAXNG_ONEORMORE:{
                xmlAutomataStatePtr oldstate;

                list = def->content;
                while (list != NULL) {
                    xmlRelaxNGCompile(ctxt, list);
                    list = list->next;
                }
                oldstate = ctxt->state;
                list = def->content;
                while (list != NULL) {
                    xmlRelaxNGCompile(ctxt, list);
                    list = list->next;
                }
                xmlAutomataNewEpsilon(ctxt->am, ctxt->state, oldstate);
                ctxt->state =
                    xmlAutomataNewEpsilon(ctxt->am, oldstate, NULL);
                break;
            }
        case XML_RELAXNG_CHOICE:{
                xmlAutomataStatePtr target = NULL;
                xmlAutomataStatePtr oldstate = ctxt->state;

                list = def->content;
                while (list != NULL) {
                    ctxt->state = oldstate;
                    ret = xmlRelaxNGCompile(ctxt, list);
                    if (ret != 0)
                        break;
                    if (target == NULL)
                        target = ctxt->state;
                    else {
                        xmlAutomataNewEpsilon(ctxt->am, ctxt->state,
                                              target);
                    }
                    list = list->next;
                }
                ctxt->state = target;

                break;
            }
        case XML_RELAXNG_REF:
        case XML_RELAXNG_EXTERNALREF:
        case XML_RELAXNG_PARENTREF:
        case XML_RELAXNG_GROUP:
        case XML_RELAXNG_DEF:
            list = def->content;
            while (list != NULL) {
                ret = xmlRelaxNGCompile(ctxt, list);
                if (ret != 0)
                    break;
                list = list->next;
            }
            break;
        case XML_RELAXNG_TEXT:{
                xmlAutomataStatePtr oldstate;

                ctxt->state =
                    xmlAutomataNewEpsilon(ctxt->am, ctxt->state, NULL);
                oldstate = ctxt->state;
                xmlRelaxNGCompile(ctxt, def->content);
                xmlAutomataNewTransition(ctxt->am, ctxt->state,
                                         ctxt->state, BAD_CAST "#text",
                                         NULL);
                ctxt->state =
                    xmlAutomataNewEpsilon(ctxt->am, oldstate, NULL);
                break;
            }
        case XML_RELAXNG_EMPTY:
            ctxt->state =
                xmlAutomataNewEpsilon(ctxt->am, ctxt->state, NULL);
            break;
        case XML_RELAXNG_EXCEPT:
        case XML_RELAXNG_ATTRIBUTE:
        case XML_RELAXNG_INTERLEAVE:
        case XML_RELAXNG_NOT_ALLOWED:
        case XML_RELAXNG_DATATYPE:
        case XML_RELAXNG_LIST:
        case XML_RELAXNG_PARAM:
        case XML_RELAXNG_VALUE:
            /* This should not happen and generate an internal error */
            fprintf(stderr, "RNG internal error trying to compile %s\n",
                    xmlRelaxNGDefName(def));
            break;
    }
    return (ret);
}